

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolrpaintgraphrenderer.cpp
# Opt level: O1

void __thiscall
QColrPaintGraphRenderer::setRadialGradient
          (QColrPaintGraphRenderer *this,QPointF c0,qreal r0,QPointF c1,qreal r1,Spread spread,
          QGradientStops *gradientStops)

{
  QTransform *this_00;
  undefined8 uVar1;
  QPainter *this_01;
  double dVar2;
  double dVar3;
  double dVar4;
  QDebug this_02;
  qreal qVar5;
  _Head_base<0UL,_QBrushData_*,_false> _Var6;
  QLoggingCategory *pQVar7;
  long lVar8;
  undefined8 *puVar9;
  QGradient *pQVar10;
  long in_FS_OFFSET;
  byte bVar11;
  float fVar12;
  float fVar13;
  double dVar14;
  QByteArrayView QVar15;
  QByteArrayView QVar16;
  QByteArrayView QVar17;
  QByteArrayView QVar18;
  QByteArrayView QVar19;
  QByteArrayView QVar20;
  QByteArrayView QVar21;
  QPointF QVar22;
  QRadialGradient gradient;
  QGradient local_120;
  QPointF local_c8;
  undefined8 local_b8;
  QDebug local_b0;
  QPointF local_a8;
  QPointF local_98;
  QDebug local_88;
  _Head_base<0UL,_QBrushData_*,_false> local_80;
  QPointF local_78;
  QPointF local_68;
  QString local_58;
  long local_38;
  
  local_78.yp = c1.yp;
  local_78.xp = c1.xp;
  bVar11 = 0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_68.xp = c0.xp;
  local_68.yp = c0.yp;
  if (this->m_painter != (QPainter *)0x0) {
    pQVar7 = QtPrivateLogging::lcColrv1();
    if (((pQVar7->field_2).bools.enabledDebug._q_value._M_base._M_i & 1U) != 0) {
      local_120.m_stops.d.size = (qsizetype)pQVar7->name;
      local_120.m_type = ConicalGradient;
      local_120._4_8_ = 0;
      local_120.m_stops.d._4_8_ = 0;
      local_120.m_stops.d.ptr._4_4_ = 0;
      QMessageLogger::debug();
      (local_b0.stream)->space = false;
      (local_b0.stream)->noQuotes = true;
      local_c8 = (QPointF)ZEXT816(0);
      local_b8 = 0;
      lVar8 = QByteArray::fill((char)&local_c8,0x20);
      puVar9 = *(undefined8 **)(lVar8 + 8);
      if (puVar9 == (undefined8 *)0x0) {
        puVar9 = &QByteArray::_empty;
      }
      QDebug::putByteArray
                ((char *)&local_b0,(ulong)puVar9,(Latin1Content)*(undefined8 *)(lVar8 + 0x10));
      if ((local_b0.stream)->space == true) {
        QTextStream::operator<<(&(local_b0.stream)->ts,' ');
      }
      this_02.stream = local_b0.stream;
      QVar15.m_data = (storage_type *)0x11;
      QVar15.m_size = (qsizetype)&local_58;
      QString::fromUtf8(QVar15);
      QTextStream::operator<<(&(this_02.stream)->ts,&local_58);
      if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
        }
      }
      if ((local_b0.stream)->space == true) {
        QTextStream::operator<<(&(local_b0.stream)->ts,' ');
      }
      local_a8.xp = (qreal)local_b0.stream;
      (local_b0.stream)->ref = (local_b0.stream)->ref + 1;
      ::operator<<((QDebug *)&local_a8.yp,&local_a8);
      qVar5 = local_a8.yp;
      QVar16.m_data = &DAT_00000006;
      QVar16.m_size = (qsizetype)&local_58;
      QString::fromUtf8(QVar16);
      QTextStream::operator<<((QTextStream *)qVar5,&local_58);
      if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (*(QTextStream *)((long)local_a8.yp + 0x30) == (QTextStream)0x1) {
        QTextStream::operator<<((QTextStream *)local_a8.yp,' ');
      }
      QTextStream::operator<<((QTextStream *)local_a8.yp,r0);
      if (*(QTextStream *)((long)local_a8.yp + 0x30) == (QTextStream)0x1) {
        QTextStream::operator<<((QTextStream *)local_a8.yp,' ');
      }
      qVar5 = local_a8.yp;
      QVar17.m_data = (storage_type *)0x2;
      QVar17.m_size = (qsizetype)&local_58;
      QString::fromUtf8(QVar17);
      QTextStream::operator<<((QTextStream *)qVar5,&local_58);
      if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (*(QTextStream *)((long)local_a8.yp + 0x30) == (QTextStream)0x1) {
        QTextStream::operator<<((QTextStream *)local_a8.yp,' ');
      }
      local_98.xp = local_a8.yp;
      *(int *)((long)local_a8.yp + 0x28) = *(int *)((long)local_a8.yp + 0x28) + 1;
      ::operator<<((QDebug *)&local_98.yp,&local_98);
      qVar5 = local_98.yp;
      QVar18.m_data = &DAT_00000006;
      QVar18.m_size = (qsizetype)&local_58;
      QString::fromUtf8(QVar18);
      QTextStream::operator<<((QTextStream *)qVar5,&local_58);
      if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (*(bool *)((long)local_98.yp + 0x30) == true) {
        QTextStream::operator<<((QTextStream *)local_98.yp,' ');
      }
      QTextStream::operator<<((QTextStream *)local_98.yp,r1);
      if (*(bool *)((long)local_98.yp + 0x30) == true) {
        QTextStream::operator<<((QTextStream *)local_98.yp,' ');
      }
      qVar5 = local_98.yp;
      QVar19.m_data = (storage_type *)0xa;
      QVar19.m_size = (qsizetype)&local_58;
      QString::fromUtf8(QVar19);
      QTextStream::operator<<((QTextStream *)qVar5,&local_58);
      if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (*(bool *)((long)local_98.yp + 0x30) == true) {
        QTextStream::operator<<((QTextStream *)local_98.yp,' ');
      }
      local_88.stream = (Stream *)local_98.yp;
      *(int *)((long)local_98.yp + 0x28) = *(int *)((long)local_98.yp + 0x28) + 1;
      qt_QMetaEnum_debugOperator
                ((QDebug *)&local_80,(longlong)&local_88,(QMetaObject *)(ulong)spread,
                 (char *)&QGradient::staticMetaObject);
      _Var6._M_head_impl = local_80._M_head_impl;
      QVar20.m_data = (storage_type *)0xe;
      QVar20.m_size = (qsizetype)&local_58;
      QString::fromUtf8(QVar20);
      QTextStream::operator<<((QTextStream *)_Var6._M_head_impl,&local_58);
      if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (*(char *)((local_80._M_head_impl)->transform).m_matrix[1] == '\x01') {
        QTextStream::operator<<((QTextStream *)local_80._M_head_impl,' ');
      }
      QTextStream::operator<<((QTextStream *)local_80._M_head_impl,(gradientStops->d).size);
      if (*(char *)((local_80._M_head_impl)->transform).m_matrix[1] == '\x01') {
        QTextStream::operator<<((QTextStream *)local_80._M_head_impl,' ');
      }
      _Var6._M_head_impl = local_80._M_head_impl;
      QVar21.m_data = (storage_type *)0x1;
      QVar21.m_size = (qsizetype)&local_58;
      QString::fromUtf8(QVar21);
      QTextStream::operator<<((QTextStream *)_Var6._M_head_impl,&local_58);
      if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (*(char *)((local_80._M_head_impl)->transform).m_matrix[1] == '\x01') {
        QTextStream::operator<<((QTextStream *)local_80._M_head_impl,' ');
      }
      QDebug::~QDebug((QDebug *)&local_80);
      QDebug::~QDebug(&local_88);
      QDebug::~QDebug((QDebug *)&local_98.yp);
      QDebug::~QDebug((QDebug *)&local_98);
      QDebug::~QDebug((QDebug *)&local_a8.yp);
      QDebug::~QDebug((QDebug *)&local_a8);
      if ((QArrayData *)local_c8.xp != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_c8.xp)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_c8.xp)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_c8.xp)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_c8.xp,1,0x10);
        }
      }
      QDebug::~QDebug(&local_b0);
    }
    local_58.d.ptr._0_4_ = SUB84(local_68.yp + 0.0,0);
    local_58.d.d = (Data *)(r0 + local_68.xp);
    local_58.d.ptr._4_4_ = (int)((ulong)(local_68.yp + 0.0) >> 0x20);
    local_c8.yp._0_4_ = SUB84(local_78.yp + 0.0,0);
    local_c8.xp = r1 + local_78.xp;
    local_c8.yp._4_4_ = (int)((ulong)(local_78.yp + 0.0) >> 0x20);
    this_00 = &this->m_currentTransform;
    QVar22 = QTransform::map(this_00,&local_68);
    local_68.xp = QVar22.xp;
    local_68.yp = QVar22.yp;
    local_58.d._0_16_ = QTransform::map(this_00,(QPointF *)&local_58);
    QVar22 = QTransform::map(this_00,&local_78);
    local_78.xp = QVar22.xp;
    local_78.yp = QVar22.yp;
    local_c8 = QTransform::map(this_00,&local_c8);
    dVar4 = (double)local_58.d.d - local_68.xp;
    dVar14 = (double)local_58.d.ptr - local_68.yp;
    dVar2 = local_c8.xp - local_78.xp;
    dVar3 = local_c8.yp - local_78.yp;
    puVar9 = &DAT_006b5de0;
    pQVar10 = &local_120;
    for (lVar8 = 0xb; lVar8 != 0; lVar8 = lVar8 + -1) {
      uVar1 = *puVar9;
      pQVar10->m_type = (int)uVar1;
      pQVar10->m_spread = (int)((ulong)uVar1 >> 0x20);
      puVar9 = puVar9 + (ulong)bVar11 * -2 + 1;
      pQVar10 = (QGradient *)((long)pQVar10 + (ulong)bVar11 * -0x10 + 8);
    }
    fVar12 = hypotf((float)dVar2,(float)dVar3);
    fVar13 = hypotf((float)dVar4,(float)dVar14);
    QRadialGradient::QRadialGradient
              ((QRadialGradient *)&local_120,&local_78,(double)fVar12,&local_68,(double)fVar13);
    QGradient::setCoordinateMode(&local_120,LogicalMode);
    local_120.m_spread = spread;
    QGradient::setStops(&local_120,gradientStops);
    this_01 = this->m_painter;
    QBrush::QBrush((QBrush *)&local_80,&local_120);
    QPainter::setBrush(this_01,(QBrush *)&local_80);
    QBrush::~QBrush((QBrush *)&local_80);
    QRadialGradient::~QRadialGradient((QRadialGradient *)&local_120);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QColrPaintGraphRenderer::setRadialGradient(QPointF c0, qreal r0,
                                                QPointF c1, qreal r1,
                                                QGradient::Spread spread,
                                                const QGradientStops &gradientStops)
{
    if (m_painter != nullptr) {
        qCDebug(lcColrv1).noquote().nospace()
            << QByteArray().fill(' ', m_oldPaths.size() * 2)
            << "[radial gradient " << c0
            << ", rad=" << r0
            << ", " << c1
            << ", rad=" << r1
            << ", spread: " << spread
            << ", stop count: " << gradientStops.size()
            << "]";

        QPointF c0e(c0 + QPointF(r0, 0.0));
        QPointF c1e(c1 + QPointF(r1, 0.0));

        c0 = m_currentTransform.map(c0);
        c0e = m_currentTransform.map(c0e);
        c1 = m_currentTransform.map(c1);
        c1e = m_currentTransform.map(c1e);

        const QVector2D d0(c0e - c0);
        const QVector2D d1(c1e - c1);

        QRadialGradient gradient(c1, d1.length(), c0, d0.length());
        gradient.setCoordinateMode(QGradient::LogicalMode);
        gradient.setSpread(spread);
        gradient.setStops(gradientStops);
        m_painter->setBrush(gradient);
    }
}